

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O0

int Abc_NtkLatchSweep(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar3;
  int local_34;
  int i;
  int RetValue;
  int Counter;
  Abc_Obj_t *pLatchPivot;
  Abc_Obj_t *pLatch;
  Abc_Obj_t *pFanin;
  Abc_Ntk_t *pNtk_local;
  
  _RetValue = (Abc_Obj_t *)0x0;
  i = 0;
  local_34 = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vBoxes);
    if (iVar1 <= local_34) {
      return i;
    }
    pObj = Abc_NtkBox(pNtk,local_34);
    iVar1 = Abc_ObjIsLatch(pObj);
    pAVar3 = _RetValue;
    if (iVar1 != 0) {
      pObj_00 = Abc_ObjFanin0(pObj);
      iVar1 = Abc_NtkCheckConstant_rec(pObj_00);
      if (iVar1 != -1) {
        if (((iVar1 == 1) && (iVar2 = Abc_LatchIsInit0(pObj), iVar2 != 0)) ||
           ((iVar1 == 0 && (iVar1 = Abc_LatchIsInit1(pObj), iVar1 != 0)))) {
          pAVar3 = pObj;
          if (_RetValue == (Abc_Obj_t *)0x0) goto LAB_00388fea;
          iVar1 = Abc_LatchInit(pObj);
          iVar2 = Abc_LatchInit(_RetValue);
          if (iVar1 == iVar2) {
            pLatch = Abc_ObjFanout0(_RetValue);
          }
          else {
            pAVar3 = Abc_ObjFanout0(_RetValue);
            pLatch = Abc_NtkCreateNodeInv(pNtk,pAVar3);
          }
        }
        else {
          pAVar3 = Abc_ObjFanin0(pObj);
          pLatch = Abc_ObjFanin0(pAVar3);
        }
        pAVar3 = Abc_ObjFanout0(pObj);
        Abc_ObjTransferFanout(pAVar3,pLatch);
        pAVar3 = Abc_ObjFanout0(pObj);
        Abc_NtkDeleteObj_rec(pAVar3,0);
        i = i + 1;
        pAVar3 = _RetValue;
      }
    }
LAB_00388fea:
    _RetValue = pAVar3;
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

int Abc_NtkLatchSweep( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pFanin, * pLatch, * pLatchPivot = NULL;
    int Counter, RetValue, i;
    Counter = 0;
    // go through the latches
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        // check if the latch has constant input
        RetValue = Abc_NtkCheckConstant_rec( Abc_ObjFanin0(pLatch) );
        if ( RetValue == -1 )
            continue;
        // found a latch with constant fanin
        if ( (RetValue == 1 && Abc_LatchIsInit0(pLatch)) ||
             (RetValue == 0 && Abc_LatchIsInit1(pLatch)) )
        {
            // fanin constant differs from the latch init value
            if ( pLatchPivot == NULL )
            {
                pLatchPivot = pLatch;
                continue;
            }
            if ( Abc_LatchInit(pLatch) != Abc_LatchInit(pLatchPivot) ) // add inverter
                pFanin = Abc_NtkCreateNodeInv( pNtk, Abc_ObjFanout0(pLatchPivot) );
            else
                pFanin = Abc_ObjFanout0(pLatchPivot);
        }
        else
            pFanin = Abc_ObjFanin0(Abc_ObjFanin0(pLatch));
        // replace latch
        Abc_ObjTransferFanout( Abc_ObjFanout0(pLatch), pFanin );
        // delete the extra nodes
        Abc_NtkDeleteObj_rec( Abc_ObjFanout0(pLatch), 0 );
        Counter++;
    }
    return Counter;
}